

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O0

char * Qentem::TestOutPut::GetColor(Colors color)

{
  bool *pbVar1;
  char *pcStack_10;
  Colors color_local;
  
  pbVar1 = IsColored();
  if ((*pbVar1 & 1U) == 0) {
switchD_00111e18_default:
    pcStack_10 = "";
  }
  else {
    switch(color) {
    case TITLE:
      pcStack_10 = "\x1b[36m";
      break;
    case ERROR:
      pcStack_10 = "\x1b[31m";
      break;
    case PASS:
      pcStack_10 = "\x1b[32m";
      break;
    case END:
      pcStack_10 = "\x1b[0m";
      break;
    default:
      goto switchD_00111e18_default;
    }
  }
  return pcStack_10;
}

Assistant:

QENTEM_NOINLINE static const char *GetColor(Colors color) noexcept {
        if (IsColored()) {
            switch (color) {
                case Colors::TITLE:
                    return "\x1B[36m";
                case Colors::ERROR:
                    return "\x1B[31m";
                case Colors::PASS:
                    return "\x1B[32m";
                case Colors::END:
                    return "\x1B[0m";
            }
        }

        return "";
    }